

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O2

void do_cb(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char **ppcVar6;
  char *pcVar7;
  DESCRIPTOR_DATA **ppDVar8;
  char buf [4608];
  char local_1238 [4616];
  
  bVar2 = is_affected_area(ch->in_room->area,(int)gsn_interference);
  if (bVar2) {
    pcVar7 = "The electrical currents in the area block your attempt to communicate.\n\r";
  }
  else {
    bVar2 = is_cabal(ch);
    if ((bVar2) && (cabal_table[ch->cabal].independent != true)) {
      if (*argument == '\0') {
        if ((ch->comm[0] & 0x80) == 0) {
          send_to_char("Cabal channel is now OFF\n\r",ch);
          *(byte *)ch->comm = (byte)ch->comm[0] | 0x80;
        }
        else {
          send_to_char("Cabal channel is now ON\n\r",ch);
          *(byte *)ch->comm = (byte)ch->comm[0] & 0x7f;
        }
        return;
      }
      bVar2 = is_shifted(ch);
      if ((!bVar2) || (bVar2 = is_immortal(ch), bVar2)) {
        bVar2 = is_affected(ch,(int)gsn_silence);
        if ((bVar2) || ((ch->in_room->room_flags[0] & 0x200000) != 0)) {
          pcVar7 = "You cannot find the words within you.\n\r";
        }
        else if ((ch->comm[0] & 0x400000) == 0) {
          bVar2 = is_affected(ch,(int)gsn_imprisonvoice);
          if (bVar2) {
            pcVar7 = "Your vocal cords are frozen solid!\n\r";
          }
          else {
            bVar2 = is_affected(ch,(int)gsn_gag);
            if (!bVar2) {
              check_ooc(ch,argument,"CB");
              bVar2 = is_affected(ch,(int)gsn_deafen);
              if (bVar2) {
                pcVar7 = upstring(argument);
                strcpy(argument,pcVar7);
              }
              uVar1 = ch->comm[0];
              ch->comm[0] = uVar1 & 0xffffffffffffff7f;
              pcVar7 = cabal_table[ch->cabal].who_name;
              bVar2 = is_npc(ch);
              if (((uint)uVar1 >> 10 & 1) == 0) {
                sprintf(local_1238,"%s%s: %s\n\r",pcVar7,(&ch->name)[(ulong)bVar2 * 4],argument);
              }
              else {
                ppcVar6 = &ch->true_name;
                if (bVar2) {
                  ppcVar6 = &ch->short_descr;
                }
                pcVar3 = *ppcVar6;
                pcVar4 = get_char_color(ch,"channels");
                pcVar5 = END_COLOR(ch);
                sprintf(local_1238,"%s%s: %s%s%s\n\r",pcVar7,pcVar3,pcVar4,argument,pcVar5);
              }
              send_to_char(local_1238,ch);
              ppDVar8 = &descriptor_list;
LAB_0029d089:
              do {
                do {
                  ppDVar8 = &((DESCRIPTOR_DATA *)ppDVar8)->next->next;
                  if ((DESCRIPTOR_DATA *)ppDVar8 == (DESCRIPTOR_DATA *)0x0) {
                    return;
                  }
                } while ((((DESCRIPTOR_DATA *)ppDVar8)->connected != 0) ||
                        (((DESCRIPTOR_DATA *)ppDVar8)->character == ch));
                bVar2 = is_same_cabal(ch,((DESCRIPTOR_DATA *)ppDVar8)->character);
                uVar1 = ((DESCRIPTOR_DATA *)ppDVar8)->character->comm[0];
                if ((!bVar2) || ((uVar1 & 0x80) != 0)) goto LAB_0029d0e7;
              } while (((((DESCRIPTOR_DATA *)ppDVar8)->character->in_room->room_flags[0] & 0x200000)
                        != 0) && ((uVar1 & 0x4000000) == 0));
              goto LAB_0029d0ee;
            }
            pcVar7 = "You are gagged and cannot speak!\n\r";
          }
        }
        else {
          pcVar7 = "The gods have revoked your channel privileges.\n\r";
        }
      }
      else {
        pcVar7 = "You can\'t seem to form the words.\n\r";
      }
    }
    else {
      pcVar7 = "You aren\'t in a cabal.\n\r";
    }
  }
  send_to_char(pcVar7,ch);
  return;
LAB_0029d0e7:
  if (((uint)uVar1 >> 0x1a & 1) != 0) {
LAB_0029d0ee:
    pcVar7 = cabal_table[ch->cabal].who_name;
    bVar2 = is_npc(ch);
    if (((uint)uVar1 >> 10 & 1) == 0) {
      if ((bVar2) || (bVar2 = can_see(((DESCRIPTOR_DATA *)ppDVar8)->character,ch), !bVar2)) {
        pcVar3 = pers(ch,((DESCRIPTOR_DATA *)ppDVar8)->character);
      }
      else {
        pcVar3 = ch->true_name;
      }
      sprintf(local_1238,"%s%s: %s\n\r",pcVar7,pcVar3,argument);
    }
    else {
      if ((bVar2) || (bVar2 = can_see(((DESCRIPTOR_DATA *)ppDVar8)->character,ch), !bVar2)) {
        pcVar3 = pers(ch,((DESCRIPTOR_DATA *)ppDVar8)->character);
      }
      else {
        pcVar3 = ch->true_name;
      }
      pcVar4 = get_char_color(((DESCRIPTOR_DATA *)ppDVar8)->character,"channels");
      pcVar5 = END_COLOR(((DESCRIPTOR_DATA *)ppDVar8)->character);
      sprintf(local_1238,"%s%s: %s%s%s\n\r",pcVar7,pcVar3,pcVar4,argument,pcVar5);
    }
    send_to_char(local_1238,((DESCRIPTOR_DATA *)ppDVar8)->character);
  }
  goto LAB_0029d089;
}

Assistant:

void do_cb(CHAR_DATA *ch, char *argument)
{
	if (is_affected_area(ch->in_room->area, gsn_interference))
	{
		send_to_char("The electrical currents in the area block your attempt to communicate.\n\r", ch);
		return;
	}

	if (!is_cabal(ch) || cabal_table[ch->cabal].independent)
	{
		send_to_char("You aren't in a cabal.\n\r", ch);
		return;
	}

	if (argument[0] == '\0')
	{
		if (IS_SET(ch->comm, COMM_NOCABAL))
		{
			send_to_char("Cabal channel is now ON\n\r", ch);
			REMOVE_BIT(ch->comm, COMM_NOCABAL);
		}
		else
		{
			send_to_char("Cabal channel is now OFF\n\r", ch);
			SET_BIT(ch->comm, COMM_NOCABAL);
		}

		return;
	}

	if (is_shifted(ch) && !is_immortal(ch))
	{
		send_to_char("You can't seem to form the words.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_silence))
	{
		send_to_char("You cannot find the words within you.\n\r", ch);
		return;
	}

	if (IS_SET(ch->in_room->room_flags, ROOM_SILENCE))
	{
		send_to_char("You cannot find the words within you.\n\r", ch);
		return;
	}

	if (IS_SET(ch->comm, COMM_NOCHANNELS))
	{
		send_to_char("The gods have revoked your channel privileges.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_imprisonvoice))
	{
		send_to_char("Your vocal cords are frozen solid!\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_gag))
	{
		send_to_char("You are gagged and cannot speak!\n\r", ch);
		return;
	}

	check_ooc(ch, argument, "CB");

	if (is_affected(ch, gsn_deafen))
		sprintf(argument, "%s", upstring(argument));

	REMOVE_BIT(ch->comm, COMM_NOCABAL);

	char buf[MAX_STRING_LENGTH];
	if (IS_SET(ch->comm, COMM_ANSI))
	{
		sprintf(buf, "%s%s: %s%s%s\n\r",
				cabal_table[ch->cabal].who_name,
				is_npc(ch) ? ch->short_descr : ch->true_name,
				get_char_color(ch, "channels"),
				argument,
				END_COLOR(ch));
	}
	else
	{
		sprintf(buf, "%s%s: %s\n\r",
				cabal_table[ch->cabal].who_name,
				is_npc(ch) ? ch->short_descr : ch->name,
				argument);
	}

	send_to_char(buf, ch);

	for (auto d = descriptor_list; d != nullptr; d = d->next)
	{
		if (d->connected == CON_PLAYING && d->character != ch && ((is_same_cabal(ch, d->character) && !IS_SET(d->character->comm, COMM_NOCABAL) && !IS_SET(d->character->in_room->room_flags, ROOM_SILENCE)) || IS_SET(d->character->comm, COMM_ALL_CABALS)))
		{
			if (IS_SET(d->character->comm, COMM_ANSI))
			{
				sprintf(buf, "%s%s: %s%s%s\n\r",
						cabal_table[ch->cabal].who_name,
						!is_npc(ch) && can_see(d->character, ch) ? ch->true_name : pers(ch, d->character),
						get_char_color(d->character, "channels"),
						argument,
						END_COLOR(d->character));
			}
			else
			{
				sprintf(buf, "%s%s: %s\n\r",
						cabal_table[ch->cabal].who_name,
						!is_npc(ch) && can_see(d->character, ch) ? ch->true_name : pers(ch, d->character),
						argument);
			}

			send_to_char(buf, d->character);
		}
	}
}